

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  long *plVar1;
  Vdbe *v_00;
  long lVar2;
  long lVar3;
  long lVar4;
  i16 iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  Parse *pParse_00;
  long *in_RDI;
  Index *pPk;
  int x;
  Table *pTab;
  SrcList_item *pTabItem;
  Index *pIdx_1;
  VdbeOp *pOp;
  int last;
  int k;
  int ws;
  int j_1;
  InLoop *pIn;
  int op;
  int j;
  int r1;
  int n;
  Index *pIdx;
  int addrSeek;
  int addr;
  sqlite3 *db;
  SrcList *pTabList;
  WhereLoop *pLoop;
  WhereLevel *pLevel;
  int i;
  Vdbe *v;
  Parse *pParse;
  Vdbe *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  WhereInfo *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Vdbe *in_stack_ffffffffffffff68;
  Table *pTab_00;
  Index *local_88;
  VdbeOp *local_80;
  int local_74;
  int local_6c;
  long local_68;
  int local_5c;
  int local_48;
  long *local_28;
  uint local_1c;
  
  plVar1 = (long *)*in_RDI;
  v_00 = (Vdbe *)plVar1[2];
  lVar2 = in_RDI[1];
  lVar3 = *plVar1;
  local_1c = (uint)*(byte *)((long)in_RDI + 0x42);
  while (local_1c = local_1c - 1, -1 < (int)local_1c) {
    plVar9 = in_RDI + (long)(int)local_1c * 0xb + 0x73;
    lVar4 = plVar9[9];
    if (*(char *)((long)plVar9 + 0x2d) == -0x55) {
      sqlite3VdbeResolveLabel(v_00,(int)plVar9[3]);
    }
    else {
      local_48 = 0;
      if ((((*(char *)((long)in_RDI + 0x47) == '\x02') &&
           (local_1c == *(byte *)((long)in_RDI + 0x42) - 1)) &&
          ((*(uint *)(lVar4 + 0x28) & 0x200) != 0)) &&
         ((((*(ushort *)(*(long *)(lVar4 + 0x20) + 99) >> 7 & 1) != 0 &&
           (uVar6 = (uint)*(ushort *)(lVar4 + 0x1e), uVar6 != 0)) &&
          (0x23 < *(short *)(*(long *)(*(long *)(lVar4 + 0x20) + 0x10) + (long)(int)uVar6 * 2))))) {
        local_5c = 0;
        while( true ) {
          iVar7 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
          if ((int)uVar6 <= local_5c) break;
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                            in_stack_ffffffffffffff60,iVar7,(int)in_stack_ffffffffffffff58);
          local_5c = local_5c + 1;
        }
        *(uint *)(plVar1 + 7) = uVar6 + 1 + (int)plVar1[7];
        local_48 = sqlite3VdbeAddOp4Int
                             ((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              iVar7,(int)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                              in_stack_ffffffffffffff50,
                              (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                          (int)in_stack_ffffffffffffff48,0);
      }
      sqlite3VdbeResolveLabel(v_00,(int)plVar9[3]);
      sqlite3VdbeAddOp3(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                        in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                        (int)in_stack_ffffffffffffff58);
      sqlite3VdbeChangeP5(v_00,(ushort)*(byte *)((long)plVar9 + 0x2f));
      if (local_48 != 0) {
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      }
    }
    if (((*(uint *)(lVar4 + 0x28) & 0x800) != 0) && (0 < (int)plVar9[7])) {
      sqlite3VdbeResolveLabel(v_00,(int)plVar9[2]);
      local_6c = (int)plVar9[7];
      local_68 = plVar9[8] + (long)(local_6c + -1) * 0x14;
      for (; 0 < local_6c; local_6c = local_6c + -1) {
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        if (*(char *)(local_68 + 0x10) != -0x55) {
          if (*(int *)(local_68 + 0xc) != 0) {
            in_stack_ffffffffffffff54 = (int)plVar9[1];
            in_stack_ffffffffffffff48 = v_00;
            sqlite3VdbeCurrentAddr(v_00);
            sqlite3VdbeAddOp4Int
                      ((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                       (int)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                       in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          }
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                            (int)in_stack_ffffffffffffff48,0);
        }
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_68 = local_68 + -0x14;
      }
    }
    sqlite3VdbeResolveLabel(v_00,*(int *)((long)plVar9 + 0xc));
    if (*(int *)((long)plVar9 + 0x14) != 0) {
      sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    }
    if ((int)plVar9[5] != 0) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                        (int)in_stack_ffffffffffffff48,0);
    }
    if ((int)*plVar9 != 0) {
      uVar6 = *(uint *)(lVar4 + 0x28);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                        (int)in_stack_ffffffffffffff48);
      if ((uVar6 & 0x40) == 0) {
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                          (int)in_stack_ffffffffffffff48);
      }
      if (((uVar6 & 0x200) != 0) || (((uVar6 & 0x2000) != 0 && (plVar9[7] != 0)))) {
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                          (int)in_stack_ffffffffffffff48);
      }
      iVar7 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      if (*(char *)((long)plVar9 + 0x2d) == 'B') {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          iVar7,(int)in_stack_ffffffffffffff48,0);
      }
      else {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),iVar7)
        ;
      }
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    }
  }
  sqlite3VdbeResolveLabel(v_00,(int)in_RDI[7]);
  local_28 = in_RDI + 0x73;
  for (local_1c = 0; (int)local_1c < (int)(uint)*(byte *)((long)in_RDI + 0x42);
      local_1c = local_1c + 1) {
    local_88 = (Index *)0x0;
    pParse_00 = (Parse *)(lVar2 + 8 + (ulong)*(byte *)((long)local_28 + 0x2c) * 0x70);
    pTab_00 = *(Table **)&pParse_00->isMultiWrite;
    lVar4 = local_28[9];
    if ((*(byte *)((long)&pParse_00->nOpAlloc + 1) >> 4 & 1) == 0) {
      if ((*(uint *)(lVar4 + 0x28) & 0x240) == 0) {
        if ((*(uint *)(lVar4 + 0x28) & 0x2000) != 0) {
          local_88 = (Index *)local_28[7];
        }
      }
      else {
        local_88 = *(Index **)(lVar4 + 0x20);
      }
      if ((local_88 != (Index *)0x0) &&
         (((*(char *)((long)in_RDI + 0x45) == '\0' || ((local_88->pTable->tabFlags & 0x20) != 0)) &&
          (*(char *)(lVar3 + 0x61) == '\0')))) {
        iVar7 = sqlite3VdbeCurrentAddr(v_00);
        local_74 = (int)local_28[4];
        local_80 = sqlite3VdbeGetOp(v_00,local_74);
        for (; local_74 < iVar7; local_74 = local_74 + 1) {
          if (local_80->p1 == *(int *)((long)local_28 + 4)) {
            if (local_80->opcode == 'Z') {
              iVar8 = local_80->p2;
              if ((pTab_00->tabFlags & 0x20) != 0) {
                in_stack_ffffffffffffff58 = (WhereInfo *)sqlite3PrimaryKeyIndex(pTab_00);
                iVar8 = (int)*(short *)((long)in_stack_ffffffffffffff58->pTabList->a +
                                       (long)iVar8 * 2 + -8);
              }
              iVar5 = sqlite3ColumnOfIndex(local_88,(i16)iVar8);
              in_stack_ffffffffffffff64 = (int)iVar5;
              if (-1 < in_stack_ffffffffffffff64) {
                local_80->p2 = in_stack_ffffffffffffff64;
                local_80->p1 = (int)local_28[1];
              }
            }
            else if (local_80->opcode == 0x81) {
              local_80->p1 = (int)local_28[1];
              local_80->opcode = 0x88;
            }
            else if (local_80->opcode == '\x15') {
              local_80->p1 = (int)local_28[1];
            }
          }
          local_80 = local_80 + 1;
        }
      }
    }
    else {
      translateColumnToCopy
                (pParse_00,(int)((ulong)pTab_00 >> 0x20),(int)pTab_00,in_stack_ffffffffffffff64,
                 in_stack_ffffffffffffff60);
    }
    local_28 = local_28 + 0xb;
  }
  *(undefined4 *)((long)plVar1 + 0xb4) = *(undefined4 *)((long)in_RDI + 0x3c);
  whereInfoFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                in_stack_ffffffffffffff58);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            assert( pLoop->wsFlags & WHERE_IN_EARLYOUT );
            sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                              sqlite3VdbeCurrentAddr(v)+2,
                              pIn->iBase, pIn->nPrefix);
            VdbeCoverage(v);
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        assert( pLevel->iTabCur==pTabList->a[pLevel->iFrom].iCursor );
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE opcodes in range %d..%d\n", k, last-1);
      }
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
      }
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}